

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# User.h
# Opt level: O1

void __thiscall User::~User(User *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->password)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->password).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->bio)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->bio).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->alias)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->alias).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->username)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->username).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

User(int id, std::string username, std::string alias, std::string bio, std::string password)
  {
	  this->id = id;
	  this->username = username;
	  this->alias = alias;
	  this->bio = bio;
	  this->password = password;
  }